

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_alloc_test(void)

{
  bool bVar1;
  bool bVar2;
  matras_id_t mVar3;
  void *pvVar4;
  reference ppvVar5;
  pair<std::_Rb_tree_const_iterator<void_*>,_bool> pVar6;
  void *data_1;
  uint prev_block_count;
  uint res_2;
  uint j_3;
  uint i_2;
  size_t provConsumedMemory_2;
  uint j_2;
  uint res_1;
  uint j_1;
  uint i_1;
  size_t provConsumedMemory;
  undefined1 local_d0;
  _Self local_c8;
  _Self local_c0;
  _Self local_b8;
  iterator itr_1;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  iterator itr;
  size_t provConsumedMemory_1;
  void *test_data;
  void *data;
  uint local_70;
  uint res;
  uint j;
  uint i;
  matras mat;
  uint maxCapacity;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_test");
  mat.stats._4_4_ = 0x100;
  alloc_err_inj_enabled = false;
  for (res = 0; res <= mat.stats._4_4_; res = res + 1) {
    matras_create((matras *)&j,0x10,&pta_allocator,(matras_stats *)0x0);
    if (mat._40_8_ != (ulong)mat.stats._4_4_) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
              "mat.capacity == maxCapacity","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x3f,"matras_alloc_test");
      exit(-1);
    }
    std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::clear(&AllocatedItems);
    for (local_70 = 0; local_70 < res; local_70 = local_70 + 1) {
      data._4_4_ = 0;
      test_data = matras_alloc((matras *)&j,(matras_id_t *)((long)&data + 4));
      if (test_data == (void *)0x0) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","data != NULL",
                "false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x44,"matras_alloc_test");
        exit(-1);
      }
      pvVar4 = matras_get((matras *)&j,data._4_4_);
      if (test_data != pvVar4) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","data == test_data",
                "false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x46,"matras_alloc_test");
        exit(-1);
      }
      mVar3 = matras_extent_count((matras *)&j);
      itr._M_node = (_Base_ptr)((ulong)mVar3 << 6);
      if (itr._M_node != (_Base_ptr)(AllocatedCount * 0x40)) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x48,"matras_alloc_test");
        exit(-1);
      }
      if (data._4_4_ != local_70) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","res == j","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x49,"matras_alloc_test");
        exit(-1);
      }
      bVar1 = std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::empty(&AllocatedBlocks);
      if (bVar1) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "!AllocatedBlocks.empty()","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x4b,"matras_alloc_test");
        exit(-1);
      }
      local_98._M_node =
           (_Base_ptr)
           std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::lower_bound
                     (&AllocatedBlocks,&test_data);
      local_a0._M_node =
           (_Base_ptr)
           std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::end(&AllocatedBlocks);
      bVar2 = std::operator==(&local_98,&local_a0);
      bVar1 = true;
      if (!bVar2) {
        ppvVar5 = std::_Rb_tree_const_iterator<void_*>::operator*(&local_98);
        bVar1 = *ppvVar5 != test_data;
      }
      if (bVar1) {
        local_a8._M_node =
             (_Base_ptr)
             std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::begin(&AllocatedBlocks);
        bVar1 = std::operator!=(&local_98,&local_a8);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "itr != AllocatedBlocks.begin()","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                  ,0x4e,"matras_alloc_test");
          exit(-1);
        }
        std::_Rb_tree_const_iterator<void_*>::operator--(&local_98);
      }
      itr_1 = std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::end(&AllocatedBlocks);
      bVar1 = std::operator!=(&local_98,&itr_1);
      pvVar4 = test_data;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "itr != AllocatedBlocks.end()","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x51,"matras_alloc_test");
        exit(-1);
      }
      ppvVar5 = std::_Rb_tree_const_iterator<void_*>::operator*(&local_98);
      if ((void *)((long)*ppvVar5 + 0x30U) < pvVar4) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "data <= (void*)( ((char*)(*itr)) + PROV_EXTENT_SIZE - PROV_BLOCK_SIZE)","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x52,"matras_alloc_test");
        exit(-1);
      }
      bVar1 = std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::empty(&AllocatedItems);
      if (!bVar1) {
        local_b8._M_node =
             (_Base_ptr)
             std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::lower_bound
                       (&AllocatedItems,&test_data);
        local_c0._M_node =
             (_Base_ptr)
             std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::end(&AllocatedItems);
        bVar1 = std::operator!=(&local_b8,&local_c0);
        if ((bVar1) &&
           (ppvVar5 = std::_Rb_tree_const_iterator<void_*>::operator*(&local_b8),
           *ppvVar5 < (void *)((long)test_data + 0x10))) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "*itr >= (void*)(((char*)data) + PROV_BLOCK_SIZE)","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                  ,0x58,"matras_alloc_test");
          exit(-1);
        }
        local_c8._M_node =
             (_Base_ptr)
             std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::begin(&AllocatedItems);
        bVar1 = std::operator!=(&local_b8,&local_c8);
        if (bVar1) {
          std::_Rb_tree_const_iterator<void_*>::operator--(&local_b8);
          pvVar4 = test_data;
          ppvVar5 = std::_Rb_tree_const_iterator<void_*>::operator*(&local_b8);
          if (pvVar4 < (void *)((long)*ppvVar5 + 0x10U)) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "data >= (void*)(((char*)(*itr)) + PROV_BLOCK_SIZE)","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                    ,0x5c,"matras_alloc_test");
            exit(-1);
          }
        }
      }
      pVar6 = std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::insert
                        (&AllocatedItems,&test_data);
      provConsumedMemory = (size_t)pVar6.first._M_node;
      local_d0 = pVar6.second;
    }
    mVar3 = matras_extent_count((matras *)&j);
    _j_1 = (ulong)mVar3 << 6;
    if (_j_1 != AllocatedCount * 0x40) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
              "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              99,"matras_alloc_test");
      exit(-1);
    }
    matras_destroy((matras *)&j);
    if (AllocatedCount != 0) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","AllocatedCount == 0",
              "false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x65,"matras_alloc_test");
      exit(-1);
    }
  }
  for (res_1 = 0; res_1 <= mat.stats._4_4_; res_1 = res_1 + 1) {
    matras_create((matras *)&j,0x10,&pta_allocator,(matras_stats *)0x0);
    for (j_2 = 0; j_2 < res_1; j_2 = j_2 + 1) {
      provConsumedMemory_2._4_4_ = 0;
      matras_alloc((matras *)&j,(matras_id_t *)((long)&provConsumedMemory_2 + 4));
    }
    for (provConsumedMemory_2._0_4_ = 0; (uint)provConsumedMemory_2 < res_1;
        provConsumedMemory_2._0_4_ = (uint)provConsumedMemory_2 + 1) {
      matras_dealloc((matras *)&j);
      mVar3 = matras_extent_count((matras *)&j);
      _j_3 = (ulong)mVar3 << 6;
      if (_j_3 != AllocatedCount * 0x40) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                ,0x71,"matras_alloc_test");
        exit(-1);
      }
    }
    if (AllocatedCount != 0) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","AllocatedCount == 0",
              "false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x73,"matras_alloc_test");
      exit(-1);
    }
    matras_destroy((matras *)&j);
  }
  alloc_err_inj_enabled = true;
  res_2 = 0;
  do {
    if (mat.stats._4_4_ < res_2) {
      alloc_err_inj_enabled = false;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x8b,
          "line %d");
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_test");
      check_plan();
      return;
    }
    matras_create((matras *)&j,0x10,&pta_allocator,(matras_stats *)0x0);
    alloc_err_inj_countdown = res_2;
    for (prev_block_count = 0; prev_block_count < mat.stats._4_4_;
        prev_block_count = prev_block_count + 1) {
      data_1._4_4_ = 0;
      data_1._0_4_ = (uint)mat.head.root;
      pvVar4 = matras_alloc((matras *)&j,(matras_id_t *)((long)&data_1 + 4));
      if (pvVar4 == (void *)0x0) {
        if ((void *)(ulong)(uint)data_1 != mat.head.root) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "prev_block_count == mat.head.block_count","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                  ,0x82,"matras_alloc_test");
          exit(-1);
        }
        break;
      }
    }
    matras_destroy((matras *)&j);
    if (AllocatedCount != 0) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","AllocatedCount == 0",
              "false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x87,"matras_alloc_test");
      exit(-1);
    }
    res_2 = res_2 + 1;
  } while( true );
}

Assistant:

void matras_alloc_test()
{
	plan(1);
	header();

	unsigned int maxCapacity =  PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);

	struct matras mat;

	alloc_err_inj_enabled = false;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		fail_unless(mat.capacity == maxCapacity);
		AllocatedItems.clear();
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			void *data = matras_alloc(&mat, &res);
			fail_unless(data != NULL);
			void *test_data = matras_get(&mat, res);
			fail_unless(data == test_data);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
			fail_unless(res == j);
			{
				fail_unless(!AllocatedBlocks.empty());
				std::set<void*>::iterator itr = AllocatedBlocks.lower_bound(data);
				if (itr == AllocatedBlocks.end() || *itr != data) {
					fail_unless(itr != AllocatedBlocks.begin());
					--itr;
				}
				fail_unless(itr != AllocatedBlocks.end());
				fail_unless(data <= (void*)( ((char*)(*itr)) + PROV_EXTENT_SIZE - PROV_BLOCK_SIZE));
			}
			{
				if (!AllocatedItems.empty()) {
					std::set<void*>::iterator itr = AllocatedItems.lower_bound(data);
					if (itr != AllocatedItems.end()) {
						fail_unless(*itr >= (void*)(((char*)data) + PROV_BLOCK_SIZE));
					}
					if (itr != AllocatedItems.begin()) {
						--itr;
						fail_unless(data >= (void*)(((char*)(*itr)) + PROV_BLOCK_SIZE));
					}
				}
			}
			AllocatedItems.insert(data);
		}
		size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
		fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			(void) matras_alloc(&mat, &res);
		}
		for (unsigned int j = 0; j < i; j++) {
			matras_dealloc(&mat);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		}
		fail_unless(AllocatedCount == 0);
		matras_destroy(&mat);
	}

	alloc_err_inj_enabled = true;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);

		alloc_err_inj_countdown = i;

		for (unsigned int j = 0; j < maxCapacity; j++) {
			unsigned int res = 0;
			unsigned int prev_block_count = mat.head.block_count;
			void *data = matras_alloc(&mat, &res);
			if (!data) {
				fail_unless(prev_block_count == mat.head.block_count);
				break;
			}
		}
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	alloc_err_inj_enabled = false;
	ok(true);

	footer();
	check_plan();
}